

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

bool __thiscall
google::protobuf::anon_unknown_19::GeneratedMessageFactory::DescriptorByNameEq::operator()
          (DescriptorByNameEq *this,DescriptorTable *lhs,string_view rhs)

{
  char *__s;
  bool bVar1;
  size_t sVar2;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  
  __s = *(char **)(this + 0x10);
  sVar2 = strlen(__s);
  __y._M_str = (char *)rhs._M_len;
  __y._M_len = (size_t)lhs;
  __x._M_str = __s;
  __x._M_len = sVar2;
  bVar1 = std::operator==(__x,__y);
  return bVar1;
}

Assistant:

bool operator()(const google::protobuf::internal::DescriptorTable* lhs,
                    absl::string_view rhs) const {
      return (*this)(lhs->filename, rhs);
    }